

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O2

void __thiscall
ot::commissioner::coap::Coap::RequestsCache::Put
          (RequestsCache *this,RequestPtr *aRequest,ResponseHandler *aHandler)

{
  function<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error)> fStack_88;
  RequestHolder local_68;
  
  std::function<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error)>::function
            (&fStack_88,aHandler);
  RequestHolder::RequestHolder(&local_68,aRequest,&fStack_88);
  Put(this,&local_68);
  RequestHolder::~RequestHolder(&local_68);
  std::_Function_base::~_Function_base(&fStack_88.super__Function_base);
  return;
}

Assistant:

void Coap::RequestsCache::Put(const RequestPtr &aRequest, ResponseHandler aHandler)
{
    Put({aRequest, aHandler});
}